

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O1

int dwarf_get_MACRO_name(uint val,char **s_out)

{
  char *pcVar1;
  
  switch(val) {
  case 1:
    pcVar1 = "DW_MACRO_define";
    break;
  case 2:
    pcVar1 = "DW_MACRO_undef";
    break;
  case 3:
    pcVar1 = "DW_MACRO_start_file";
    break;
  case 4:
    pcVar1 = "DW_MACRO_end_file";
    break;
  case 5:
    pcVar1 = "DW_MACRO_define_strp";
    break;
  case 6:
    pcVar1 = "DW_MACRO_undef_strp";
    break;
  case 7:
    pcVar1 = "DW_MACRO_import";
    break;
  case 8:
    pcVar1 = "DW_MACRO_define_sup";
    break;
  case 9:
    pcVar1 = "DW_MACRO_undef_sup";
    break;
  case 10:
    pcVar1 = "DW_MACRO_import_sup";
    break;
  case 0xb:
    pcVar1 = "DW_MACRO_define_strx";
    break;
  case 0xc:
    pcVar1 = "DW_MACRO_undef_strx";
    break;
  default:
    if (val == 0xe0) {
      pcVar1 = "DW_MACRO_lo_user";
    }
    else {
      if (val != 0xff) {
        return -1;
      }
      pcVar1 = "DW_MACRO_hi_user";
    }
  }
  *s_out = pcVar1;
  return 0;
}

Assistant:

int
dwarf_get_MACRO_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_MACRO_define:
        *s_out = "DW_MACRO_define";
        return DW_DLV_OK;
    case DW_MACRO_undef:
        *s_out = "DW_MACRO_undef";
        return DW_DLV_OK;
    case DW_MACRO_start_file:
        *s_out = "DW_MACRO_start_file";
        return DW_DLV_OK;
    case DW_MACRO_end_file:
        *s_out = "DW_MACRO_end_file";
        return DW_DLV_OK;
    case DW_MACRO_define_strp:
        *s_out = "DW_MACRO_define_strp";
        return DW_DLV_OK;
    case DW_MACRO_undef_strp:
        *s_out = "DW_MACRO_undef_strp";
        return DW_DLV_OK;
    case DW_MACRO_import:
        *s_out = "DW_MACRO_import";
        return DW_DLV_OK;
    case DW_MACRO_define_sup:
        *s_out = "DW_MACRO_define_sup";
        return DW_DLV_OK;
    case DW_MACRO_undef_sup:
        *s_out = "DW_MACRO_undef_sup";
        return DW_DLV_OK;
    case DW_MACRO_import_sup:
        *s_out = "DW_MACRO_import_sup";
        return DW_DLV_OK;
    case DW_MACRO_define_strx:
        *s_out = "DW_MACRO_define_strx";
        return DW_DLV_OK;
    case DW_MACRO_undef_strx:
        *s_out = "DW_MACRO_undef_strx";
        return DW_DLV_OK;
    case DW_MACRO_lo_user:
        *s_out = "DW_MACRO_lo_user";
        return DW_DLV_OK;
    case DW_MACRO_hi_user:
        *s_out = "DW_MACRO_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}